

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O2

void __thiscall chrono::robosimian::RoboSimian::Output(RoboSimian *this)

{
  double dVar1;
  ostream *poVar2;
  int i;
  long lVar3;
  long lVar4;
  array<double,_8UL> speeds;
  array<double,_8UL> angles;
  array<double,_8UL> torques;
  array<double,_8UL> local_f0;
  array<double,_8UL> local_b0;
  array<double,_8UL> local_70;
  
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    poVar2 = (ostream *)(&this->field_0x108 + lVar3 * 0x200);
    std::ostream::_M_insert<double>(*(double *)(this->m_system + 0x1a8));
    RS_Limb::GetMotorAngles
              (&local_b0,
               (this->m_limbs).
               super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar3].
               super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 8) {
      dVar1 = *(double *)((long)local_b0._M_elems + lVar4);
      std::operator<<(poVar2,"  ");
      std::ostream::_M_insert<double>(dVar1);
    }
    RS_Limb::GetMotorOmegas
              (&local_f0,
               (this->m_limbs).
               super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar3].
               super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 8) {
      dVar1 = *(double *)((long)local_f0._M_elems + lVar4);
      std::operator<<(poVar2,"  ");
      std::ostream::_M_insert<double>(dVar1);
    }
    RS_Limb::GetMotorTorques
              (&local_70,
               (this->m_limbs).
               super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar3].
               super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 8) {
      dVar1 = *(double *)((long)local_70._M_elems + lVar4);
      std::operator<<(poVar2,"  ");
      std::ostream::_M_insert<double>(dVar1);
    }
    RS_Limb::GetMotorActuations
              ((this->m_limbs).
               super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar3].
               super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &local_b0,&local_f0);
    for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 8) {
      dVar1 = *(double *)((long)local_b0._M_elems + lVar4);
      std::operator<<(poVar2,"  ");
      std::ostream::_M_insert<double>(dVar1);
    }
    for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 8) {
      dVar1 = *(double *)((long)local_f0._M_elems + lVar4);
      std::operator<<(poVar2,"  ");
      std::ostream::_M_insert<double>(dVar1);
    }
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return;
}

Assistant:

void RoboSimian::Output() {
    for (int i = 0; i < 4; i++) {
        // Current motor angles
        m_outf[i] << m_system->GetChTime();
        std::array<double, 8> angles = m_limbs[i]->GetMotorAngles();
        for (auto v : angles) {
            m_outf[i] << "  " << v;
        }
        // Current motor angular speeds
        std::array<double, 8> speeds = m_limbs[i]->GetMotorOmegas();
        for (auto v : speeds) {
            m_outf[i] << "  " << v;
        }
        // Current motor (reaction) torques
        std::array<double, 8> torques = m_limbs[i]->GetMotorTorques();
        for (auto v : torques) {
            m_outf[i] << "  " << v;
        }
        // Actuations data
        m_limbs[i]->GetMotorActuations(angles, speeds);
        for (auto v : angles) {
            m_outf[i] << "  " << v;
        }
        for (auto v : speeds) {
            m_outf[i] << "  " << v;
        }
        m_outf[i] << std::endl;
    }
}